

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void getPosFloatOrInf(char *attrName,int argc,char **argv,int *i,int part,SetAttrVector *attrs)

{
  int iVar1;
  invalid_argument *piVar2;
  ostream *poVar3;
  vector<SetAttr,_std::allocator<SetAttr>_> *this;
  int *in_RCX;
  long in_RDX;
  int in_ESI;
  SetAttr *in_RDI;
  undefined4 in_R8D;
  string *in_R9;
  double dVar4;
  stringstream e;
  float f;
  undefined4 in_stack_fffffffffffffd68;
  half *in_stack_fffffffffffffd70;
  allocator<char> *in_stack_fffffffffffffda0;
  char *in_stack_fffffffffffffda8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdb0;
  string local_248 [87];
  undefined1 local_1f1;
  string local_1f0 [32];
  stringstream local_1d0 [16];
  ostream local_1c0 [382];
  uint16_t local_42;
  float local_40;
  string *local_30;
  undefined4 local_24;
  int *local_20;
  long local_18;
  SetAttr *local_8;
  
  if (in_ESI + -2 < *in_RCX) {
    piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar2,"Expected a positive float (or \"infinity\")");
    __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  local_30 = in_R9;
  local_24 = in_R8D;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_8 = in_RDI;
  iVar1 = strcmp(*(char **)(in_RDX + (long)(*in_RCX + 1) * 8),"inf");
  if ((iVar1 == 0) ||
     (iVar1 = strcmp(*(char **)(local_18 + (long)(*local_20 + 1) * 8),"infinity"), iVar1 == 0)) {
    local_42 = (uint16_t)Imath_3_2::half::posInf();
    local_40 = Imath_3_2::half::operator_cast_to_float(in_stack_fffffffffffffd70);
  }
  else {
    dVar4 = strtod(*(char **)(local_18 + (long)(*local_20 + 1) * 8),(char **)0x0);
    local_40 = (float)dVar4;
    if (local_40 <= 0.0) {
      std::__cxx11::stringstream::stringstream(local_1d0);
      poVar3 = std::operator<<(local_1c0,"The value for the ");
      poVar3 = std::operator<<(poVar3,(char *)local_8);
      std::operator<<(poVar3," attribute must be greater than zero, or \"infinity\"");
      local_1f1 = 1;
      piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringstream::str();
      std::invalid_argument::invalid_argument(piVar2,local_1f0);
      local_1f1 = 0;
      __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
  this = (vector<SetAttr,_std::allocator<SetAttr>_> *)operator_new(0x10);
  Imf_3_4::TypedAttribute<float>::TypedAttribute((float *)this);
  SetAttr::SetAttr(local_8,local_30,(int)((ulong)this >> 0x20),
                   (Attribute *)CONCAT44(local_24,in_stack_fffffffffffffd68));
  std::vector<SetAttr,_std::allocator<SetAttr>_>::push_back
            (this,(value_type *)CONCAT44(local_24,in_stack_fffffffffffffd68));
  SetAttr::~SetAttr((SetAttr *)0x105619);
  std::__cxx11::string::~string(local_248);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffdb7);
  *local_20 = *local_20 + 2;
  return;
}

Assistant:

void
getPosFloatOrInf (
    const char     attrName[],
    int            argc,
    char**         argv,
    int&           i,
    int            part,
    SetAttrVector& attrs)
{
    if (i > argc - 2)
        throw invalid_argument ("Expected a positive float (or \"infinity\")");

    float f;

    if (!strcmp (argv[i + 1], "inf") || !strcmp (argv[i + 1], "infinity"))
    {
        f = float (half::posInf ());
    }
    else
    {
        f = static_cast<float> (strtod (argv[i + 1], 0));

        if (f <= 0)
        {
            std::stringstream e;
            e << "The value for the " << attrName
              << " attribute must be greater than zero, or \"infinity\"";
            throw invalid_argument (e.str ());
        }
    }

    attrs.push_back (SetAttr (attrName, part, new FloatAttribute (f)));
    i += 2;
}